

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuApp.cpp
# Opt level: O0

void __thiscall tcu::App::onWatchdogTimeout(App *this)

{
  bool bVar1;
  TestLog *this_00;
  App *this_local;
  
  bVar1 = de::Mutex::tryLock(&this->m_crashLock);
  if ((bVar1) && ((this->m_crashed & 1U) == 0)) {
    this->m_crashed = true;
    this_00 = TestContext::getLog(this->m_testCtx);
    TestLog::terminateCase(this_00,QP_TEST_RESULT_TIMEOUT);
    die("Watchdog timer timeout");
  }
  return;
}

Assistant:

void App::onWatchdogTimeout (void)
{
	if (!m_crashLock.tryLock() || m_crashed)
		return; // In crash handler already.

	m_crashed = true;

	m_testCtx->getLog().terminateCase(QP_TEST_RESULT_TIMEOUT);
	die("Watchdog timer timeout");
}